

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

ScriptFunctionType * __thiscall Js::FunctionProxy::AllocDeferredPrototypeType(FunctionProxy *this)

{
  code *pcVar1;
  bool bVar2;
  ScriptFunctionType **ppSVar3;
  undefined4 *puVar4;
  ScriptFunctionType *ptr;
  ScriptFunctionType *type;
  FunctionProxy *this_local;
  
  ppSVar3 = Memory::WriteBarrierPtr::operator_cast_to_ScriptFunctionType__
                      ((WriteBarrierPtr *)&this->deferredPrototypeType);
  if (*ppSVar3 != (ScriptFunctionType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x83a,"(deferredPrototypeType == nullptr)",
                                "deferredPrototypeType == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ptr = ScriptFunctionType::New(this,true);
  Memory::WriteBarrierPtr<Js::ScriptFunctionType>::operator=(&this->deferredPrototypeType,ptr);
  return ptr;
}

Assistant:

ScriptFunctionType * FunctionProxy::AllocDeferredPrototypeType()
    {
        Assert(deferredPrototypeType == nullptr);
        ScriptFunctionType * type = ScriptFunctionType::New(this, true);
        deferredPrototypeType = type;
        return type;
    }